

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O1

void Ssw_RarTranspose(Ssw_RarMan_t *p)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Aig_Man_t *pAVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  word wVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  word M [64];
  long local_278;
  word local_238 [65];
  
  iVar1 = p->pPars->nWords;
  if (0 < (long)iVar1) {
    uVar2 = p->nWordsReg;
    lVar14 = (long)(int)uVar2;
    local_278 = lVar14 * 0x1f8;
    iVar15 = 0x3f;
    lVar10 = 0;
    do {
      if (0 < (int)uVar2) {
        pAVar4 = p->pAig;
        iVar3 = pAVar4->nRegs;
        lVar11 = 0x3f;
        uVar13 = 0;
        lVar12 = local_278;
        do {
          lVar6 = 0;
          lVar5 = lVar11;
          do {
            if (lVar5 < iVar3) {
              uVar8 = (ulong)(uint)pAVar4->nTruePos + lVar5;
              iVar7 = (int)uVar8;
              if ((iVar7 < 0) || (pAVar4->vCos->nSize <= iVar7)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              iVar7 = *(int *)((long)pAVar4->vCos->pArray[uVar8 & 0xffffffff] + 0x24);
              if (pAVar4->vObjs->nSize <= iVar7) {
                __assert_fail("Id < Aig_ManObjNumMax(p->pAig)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswRarity.c"
                              ,0x53,"word *Ssw_RarObjSim(Ssw_RarMan_t *, int)");
              }
              wVar9 = p->pObjData[iVar7 * iVar1 + lVar10];
            }
            else {
              wVar9 = 0;
            }
            local_238[lVar6] = wVar9;
            lVar6 = lVar6 + 1;
            lVar5 = lVar5 + -1;
          } while (lVar6 != 0x40);
          transpose64(local_238);
          lVar6 = 0;
          lVar5 = lVar12;
          do {
            if (iVar1 * 0x40 <= iVar15) {
              __assert_fail("Id < 64 * p->pPars->nWords",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswRarity.c"
                            ,0x54,"word *Ssw_RarPatSim(Ssw_RarMan_t *, int)");
            }
            *(word *)((long)p->pPatData + lVar5) = local_238[lVar6];
            lVar6 = lVar6 + 1;
            lVar5 = lVar5 + lVar14 * -8;
          } while (lVar6 != 0x40);
          uVar13 = uVar13 + 1;
          lVar11 = lVar11 + 0x40;
          lVar12 = lVar12 + 8;
        } while (uVar13 != uVar2);
      }
      lVar10 = lVar10 + 1;
      iVar15 = iVar15 + 0x40;
      local_278 = local_278 + lVar14 * 0x200;
    } while (lVar10 != iVar1);
  }
  return;
}

Assistant:

void Ssw_RarTranspose( Ssw_RarMan_t * p )
{
    Aig_Obj_t * pObj;
    word M[64];
    int w, r, i;
    for ( w = 0; w < p->pPars->nWords; w++ )
    for ( r = 0; r < p->nWordsReg; r++ )
    {
        // save input
        for ( i = 0; i < 64; i++ )
        {
            if ( r*64 + 63-i < Aig_ManRegNum(p->pAig) )
            {
                pObj = Saig_ManLi( p->pAig, r*64 + 63-i );
                M[i] = Ssw_RarObjSim( p, Aig_ObjId(pObj) )[w];
            }
            else
                M[i] = 0;
        }
        // transpose
        transpose64( M );
        // save output
        for ( i = 0; i < 64; i++ )
            Ssw_RarPatSim( p, w*64 + 63-i )[r] = M[i];
    }
/*
    Saig_ManForEachLi( p->pAig, pObj, i )
    {
        word * pBitData = Ssw_RarObjSim( p, Aig_ObjId(pObj) );
        Extra_PrintBinary( stdout, (unsigned *)pBitData, 64*p->pPars->nWords ); Abc_Print( 1, "\n" );
    }
    Abc_Print( 1, "\n" );
    for ( i = 0; i < p->pPars->nWords*64; i++ )
    {
        word * pBitData = Ssw_RarPatSim( p, i );
        Extra_PrintBinary( stdout, (unsigned *)pBitData, Aig_ManRegNum(p->pAig) ); Abc_Print( 1, "\n" );
    }
    Abc_Print( 1, "\n" );
*/
}